

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::GetLine_abi_cxx11_(Parser *this,unsigned_long i)

{
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  size_type pos;
  size_t prec;
  unsigned_long lines;
  allocator local_31;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_20 = 0;
  local_28 = 0;
  local_18 = in_RDX;
  local_30 = std::__cxx11::string::find((char *)(in_RSI + 0x4f8),0x1d8c2a);
  while( true ) {
    if (local_30 == -1) {
      if (local_20 == local_18) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)in_RDI,in_RSI + 0x4f8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"",&local_31);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
      }
      return in_RDI;
    }
    if ((local_20 == local_18) && (local_30 - local_28 != 1)) break;
    local_20 = local_20 + 1;
    local_28 = local_30;
    local_30 = std::__cxx11::string::find((char *)(in_RSI + 0x4f8),0x1d8c2a);
  }
  std::__cxx11::string::substr((ulong)in_RDI,in_RSI + 0x4f8);
  return in_RDI;
}

Assistant:

std::string Parser::GetLine(unsigned long i) const
{
 unsigned long lines = 0;
 size_t prec = 0;
 auto pos = m_Buffer.find("\n", 0);
 while(pos != std::string::npos)
   {
   if(lines == i)
     {
     if(pos-prec-1>0)
       {
       return m_Buffer.substr(prec,pos-prec-1);
       }
     }
   lines++;
   prec = pos;
   pos = m_Buffer.find("\n",pos+1);
   }

  if(lines == i)
    {
    return m_Buffer.substr(prec,m_Buffer.size()-prec);
    }

 return "";
}